

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O3

shared_ptr<pstack::Elf::Object> __thiscall
pstack::Context::getImageIfLoaded(Context *this,string *name)

{
  _Base_ptr p_Var1;
  undefined4 uVar2;
  iterator iVar3;
  key_type *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<pstack::Elf::Object> sVar4;
  
  elfLookups = elfLookups + 1;
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>_>_>
                  *)&name[1].field_2,in_RDX);
  if (iVar3._M_node == (_Base_ptr)((long)&name[1].field_2 + 8)) {
    *(undefined8 *)&(this->dwarfCache)._M_t._M_impl = 0;
    *(undefined8 *)&(this->dwarfCache)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  }
  else {
    elfHits = elfHits + 1;
    uVar2 = *(undefined4 *)&iVar3._M_node[2].field_0x4;
    *(_Rb_tree_color *)&(this->dwarfCache)._M_t._M_impl.field_0x0 = iVar3._M_node[2]._M_color;
    *(undefined4 *)&(this->dwarfCache)._M_t._M_impl.field_0x4 = uVar2;
    p_Var1 = iVar3._M_node[2]._M_parent;
    *(_Base_ptr *)&(this->dwarfCache)._M_t._M_impl.super__Rb_tree_header._M_header = p_Var1;
    if (p_Var1 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
      }
    }
  }
  sVar4.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<pstack::Elf::Object>)
         sVar4.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Elf::Object>
Context::getImageIfLoaded(const std::string &name)
{
    elfLookups++;
    auto it = elfCache.find(name);
    if (it != elfCache.end()) {
        elfHits++;
        return it->second;
    }
    return {};
}